

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_DETECT_OBJECTS(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  _Bool objects;
  effect_handler_context_t_conflict *context_local;
  
  _Var1 = detect_stuff(context,tval_is_not_money);
  if (_Var1) {
    msg("You detect the presence of objects!");
  }
  else if ((context->aware & 1U) != 0) {
    msg("You detect no objects.");
  }
  player->upkeep->redraw = player->upkeep->redraw | 0x800000;
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_DETECT_OBJECTS(effect_handler_context_t *context)
{
	bool objects = detect_stuff(context, tval_is_not_money);

	if (objects) {
		msg("You detect the presence of objects!");
	} else if (context->aware) {
		msg("You detect no objects.");
	}

	/* Redraw object list */
	player->upkeep->redraw |= PR_ITEMLIST;

	context->ident = true;
	return true;
}